

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colour.cpp
# Opt level: O0

void __thiscall Colour::Colour(Colour *this,string *name,int r,int g,int b)

{
  GLfloat *pGVar1;
  int b_local;
  int g_local;
  int r_local;
  string *name_local;
  Colour *this_local;
  
  std::__cxx11::string::string((string *)&this->name);
  this->r = r;
  this->g = g;
  this->b = b;
  pGVar1 = (GLfloat *)operator_new__(0xc);
  this->colour = pGVar1;
  *this->colour = (float)r / 255.0;
  this->colour[1] = (float)g / 255.0;
  this->colour[2] = (float)b / 255.0;
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  return;
}

Assistant:

Colour::Colour(const string& name, int r, int g, int b) {
    this->r = r;
    this->g = g;
    this->b = b;
    
    colour = new GLfloat[3];
    this->colour[0] = r/255.f;
    this->colour[1] = g/255.f;
    this->colour[2] = b/255.f;
    
    this->name = name;
}